

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O2

void __thiscall DStrifeStatusBar::ShowPop(DStrifeStatusBar *this,int popnum)

{
  bool bVar1;
  APlayerPawn *this_00;
  int iVar2;
  
  DBaseStatusBar::ShowPop(&this->super_DBaseStatusBar,popnum);
  if (this->CurrentPop == popnum) {
    if (popnum == 2) {
      this->KeyPopPos = this->KeyPopPos + 10;
      this->KeyPopScroll = 0x118;
      this_00 = ((this->super_DBaseStatusBar).CPlayer)->mo;
      iVar2 = 0;
      while (this_00 = (APlayerPawn *)
                       GC::ReadBarrier<AInventory>
                                 ((AInventory **)&(this_00->super_AActor).Inventory),
            this_00 != (APlayerPawn *)0x0) {
        bVar1 = DObject::IsKindOf((DObject *)this_00,AKey::RegistrationInfo.MyClass);
        if (bVar1) {
          if (iVar2 == this->KeyPopPos) {
            return;
          }
          iVar2 = iVar2 + 1;
        }
      }
    }
    this->PendingPop = 0;
    this->KeyPopScroll = 0;
    this->KeyPopPos = this->KeyPopPos + -10;
  }
  else {
    this->KeyPopPos = 0;
    this->PendingPop = popnum;
  }
  return;
}

Assistant:

void ShowPop (int popnum)
	{
		DBaseStatusBar::ShowPop(popnum);
		if (popnum == CurrentPop)
		{
			if (popnum == POP_Keys)
			{
				AInventory *item;
				int i;

				KeyPopPos += 10;
				KeyPopScroll = 280;

				for (item = CPlayer->mo->Inventory, i = 0;
					item != NULL;
					item = item->Inventory)
				{
					if (item->IsKindOf (RUNTIME_CLASS(AKey)))
					{
						if (i == KeyPopPos)
						{
							return;
						}
						i++;
					}
				}
			}
			PendingPop = POP_None;
			// Do not scroll keys horizontally when dropping the popscreen
			KeyPopScroll = 0;
			KeyPopPos -= 10;
		}
		else
		{
			KeyPopPos = 0;
			PendingPop = popnum;
		}
	}